

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btIDebugDraw.h
# Opt level: O0

void __thiscall
btIDebugDraw::drawBox(btIDebugDraw *this,btVector3 *bbMin,btVector3 *bbMax,btVector3 *color)

{
  btScalar *pbVar1;
  btScalar *pbVar2;
  btScalar *pbVar3;
  undefined8 in_RCX;
  btVector3 *in_RDX;
  btVector3 *in_RSI;
  long *in_RDI;
  btVector3 local_1a0;
  btVector3 local_190;
  btVector3 local_180;
  btVector3 local_170;
  btVector3 local_160;
  btVector3 local_150;
  btVector3 local_140;
  btVector3 local_130;
  btVector3 local_120;
  btVector3 local_110;
  btVector3 local_100;
  btVector3 local_f0;
  btVector3 local_e0;
  btVector3 local_d0;
  btVector3 local_c0;
  btVector3 local_b0;
  btVector3 local_a0;
  btVector3 local_90;
  btVector3 local_80;
  btVector3 local_70;
  btVector3 local_60;
  btVector3 local_50;
  btVector3 local_40;
  btVector3 local_30;
  undefined8 local_20;
  btVector3 *local_18;
  btVector3 *local_10;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pbVar1 = btVector3::operator_cast_to_float_(in_RSI);
  pbVar2 = btVector3::operator_cast_to_float_(local_10);
  pbVar3 = btVector3::operator_cast_to_float_(local_10);
  btVector3::btVector3(&local_30,pbVar1,pbVar2 + 1,pbVar3 + 2);
  pbVar1 = btVector3::operator_cast_to_float_(local_18);
  pbVar2 = btVector3::operator_cast_to_float_(local_10);
  pbVar3 = btVector3::operator_cast_to_float_(local_10);
  btVector3::btVector3(&local_40,pbVar1,pbVar2 + 1,pbVar3 + 2);
  (**(code **)(*in_RDI + 0x20))(in_RDI,&local_30,&local_40,local_20);
  pbVar1 = btVector3::operator_cast_to_float_(local_18);
  pbVar2 = btVector3::operator_cast_to_float_(local_10);
  pbVar3 = btVector3::operator_cast_to_float_(local_10);
  btVector3::btVector3(&local_50,pbVar1,pbVar2 + 1,pbVar3 + 2);
  pbVar1 = btVector3::operator_cast_to_float_(local_18);
  pbVar2 = btVector3::operator_cast_to_float_(local_18);
  pbVar3 = btVector3::operator_cast_to_float_(local_10);
  btVector3::btVector3(&local_60,pbVar1,pbVar2 + 1,pbVar3 + 2);
  (**(code **)(*in_RDI + 0x20))(in_RDI,&local_50,&local_60,local_20);
  pbVar1 = btVector3::operator_cast_to_float_(local_18);
  pbVar2 = btVector3::operator_cast_to_float_(local_18);
  pbVar3 = btVector3::operator_cast_to_float_(local_10);
  btVector3::btVector3(&local_70,pbVar1,pbVar2 + 1,pbVar3 + 2);
  pbVar1 = btVector3::operator_cast_to_float_(local_10);
  pbVar2 = btVector3::operator_cast_to_float_(local_18);
  pbVar3 = btVector3::operator_cast_to_float_(local_10);
  btVector3::btVector3(&local_80,pbVar1,pbVar2 + 1,pbVar3 + 2);
  (**(code **)(*in_RDI + 0x20))(in_RDI,&local_70,&local_80,local_20);
  pbVar1 = btVector3::operator_cast_to_float_(local_10);
  pbVar2 = btVector3::operator_cast_to_float_(local_18);
  pbVar3 = btVector3::operator_cast_to_float_(local_10);
  btVector3::btVector3(&local_90,pbVar1,pbVar2 + 1,pbVar3 + 2);
  pbVar1 = btVector3::operator_cast_to_float_(local_10);
  pbVar2 = btVector3::operator_cast_to_float_(local_10);
  pbVar3 = btVector3::operator_cast_to_float_(local_10);
  btVector3::btVector3(&local_a0,pbVar1,pbVar2 + 1,pbVar3 + 2);
  (**(code **)(*in_RDI + 0x20))(in_RDI,&local_90,&local_a0,local_20);
  pbVar1 = btVector3::operator_cast_to_float_(local_10);
  pbVar2 = btVector3::operator_cast_to_float_(local_10);
  pbVar3 = btVector3::operator_cast_to_float_(local_10);
  btVector3::btVector3(&local_b0,pbVar1,pbVar2 + 1,pbVar3 + 2);
  pbVar1 = btVector3::operator_cast_to_float_(local_10);
  pbVar2 = btVector3::operator_cast_to_float_(local_10);
  pbVar3 = btVector3::operator_cast_to_float_(local_18);
  btVector3::btVector3(&local_c0,pbVar1,pbVar2 + 1,pbVar3 + 2);
  (**(code **)(*in_RDI + 0x20))(in_RDI,&local_b0,&local_c0,local_20);
  pbVar1 = btVector3::operator_cast_to_float_(local_18);
  pbVar2 = btVector3::operator_cast_to_float_(local_10);
  pbVar3 = btVector3::operator_cast_to_float_(local_10);
  btVector3::btVector3(&local_d0,pbVar1,pbVar2 + 1,pbVar3 + 2);
  pbVar1 = btVector3::operator_cast_to_float_(local_18);
  pbVar2 = btVector3::operator_cast_to_float_(local_10);
  pbVar3 = btVector3::operator_cast_to_float_(local_18);
  btVector3::btVector3(&local_e0,pbVar1,pbVar2 + 1,pbVar3 + 2);
  (**(code **)(*in_RDI + 0x20))(in_RDI,&local_d0,&local_e0,local_20);
  pbVar1 = btVector3::operator_cast_to_float_(local_18);
  pbVar2 = btVector3::operator_cast_to_float_(local_18);
  pbVar3 = btVector3::operator_cast_to_float_(local_10);
  btVector3::btVector3(&local_f0,pbVar1,pbVar2 + 1,pbVar3 + 2);
  pbVar1 = btVector3::operator_cast_to_float_(local_18);
  pbVar2 = btVector3::operator_cast_to_float_(local_18);
  pbVar3 = btVector3::operator_cast_to_float_(local_18);
  btVector3::btVector3(&local_100,pbVar1,pbVar2 + 1,pbVar3 + 2);
  (**(code **)(*in_RDI + 0x20))(in_RDI,&local_f0,&local_100,local_20);
  pbVar1 = btVector3::operator_cast_to_float_(local_10);
  pbVar2 = btVector3::operator_cast_to_float_(local_18);
  pbVar3 = btVector3::operator_cast_to_float_(local_10);
  btVector3::btVector3(&local_110,pbVar1,pbVar2 + 1,pbVar3 + 2);
  pbVar1 = btVector3::operator_cast_to_float_(local_10);
  pbVar2 = btVector3::operator_cast_to_float_(local_18);
  pbVar3 = btVector3::operator_cast_to_float_(local_18);
  btVector3::btVector3(&local_120,pbVar1,pbVar2 + 1,pbVar3 + 2);
  (**(code **)(*in_RDI + 0x20))(in_RDI,&local_110,&local_120,local_20);
  pbVar1 = btVector3::operator_cast_to_float_(local_10);
  pbVar2 = btVector3::operator_cast_to_float_(local_10);
  pbVar3 = btVector3::operator_cast_to_float_(local_18);
  btVector3::btVector3(&local_130,pbVar1,pbVar2 + 1,pbVar3 + 2);
  pbVar1 = btVector3::operator_cast_to_float_(local_18);
  pbVar2 = btVector3::operator_cast_to_float_(local_10);
  pbVar3 = btVector3::operator_cast_to_float_(local_18);
  btVector3::btVector3(&local_140,pbVar1,pbVar2 + 1,pbVar3 + 2);
  (**(code **)(*in_RDI + 0x20))(in_RDI,&local_130,&local_140,local_20);
  pbVar1 = btVector3::operator_cast_to_float_(local_18);
  pbVar2 = btVector3::operator_cast_to_float_(local_10);
  pbVar3 = btVector3::operator_cast_to_float_(local_18);
  btVector3::btVector3(&local_150,pbVar1,pbVar2 + 1,pbVar3 + 2);
  pbVar1 = btVector3::operator_cast_to_float_(local_18);
  pbVar2 = btVector3::operator_cast_to_float_(local_18);
  pbVar3 = btVector3::operator_cast_to_float_(local_18);
  btVector3::btVector3(&local_160,pbVar1,pbVar2 + 1,pbVar3 + 2);
  (**(code **)(*in_RDI + 0x20))(in_RDI,&local_150,&local_160,local_20);
  pbVar1 = btVector3::operator_cast_to_float_(local_18);
  pbVar2 = btVector3::operator_cast_to_float_(local_18);
  pbVar3 = btVector3::operator_cast_to_float_(local_18);
  btVector3::btVector3(&local_170,pbVar1,pbVar2 + 1,pbVar3 + 2);
  pbVar1 = btVector3::operator_cast_to_float_(local_10);
  pbVar2 = btVector3::operator_cast_to_float_(local_18);
  pbVar3 = btVector3::operator_cast_to_float_(local_18);
  btVector3::btVector3(&local_180,pbVar1,pbVar2 + 1,pbVar3 + 2);
  (**(code **)(*in_RDI + 0x20))(in_RDI,&local_170,&local_180,local_20);
  pbVar1 = btVector3::operator_cast_to_float_(local_10);
  pbVar2 = btVector3::operator_cast_to_float_(local_18);
  pbVar3 = btVector3::operator_cast_to_float_(local_18);
  btVector3::btVector3(&local_190,pbVar1,pbVar2 + 1,pbVar3 + 2);
  pbVar1 = btVector3::operator_cast_to_float_(local_10);
  pbVar2 = btVector3::operator_cast_to_float_(local_10);
  pbVar3 = btVector3::operator_cast_to_float_(local_18);
  btVector3::btVector3(&local_1a0,pbVar1,pbVar2 + 1,pbVar3 + 2);
  (**(code **)(*in_RDI + 0x20))(in_RDI,&local_190,&local_1a0,local_20);
  return;
}

Assistant:

virtual void drawBox(const btVector3& bbMin, const btVector3& bbMax, const btVector3& color)
	{
		drawLine(btVector3(bbMin[0], bbMin[1], bbMin[2]), btVector3(bbMax[0], bbMin[1], bbMin[2]), color);
		drawLine(btVector3(bbMax[0], bbMin[1], bbMin[2]), btVector3(bbMax[0], bbMax[1], bbMin[2]), color);
		drawLine(btVector3(bbMax[0], bbMax[1], bbMin[2]), btVector3(bbMin[0], bbMax[1], bbMin[2]), color);
		drawLine(btVector3(bbMin[0], bbMax[1], bbMin[2]), btVector3(bbMin[0], bbMin[1], bbMin[2]), color);
		drawLine(btVector3(bbMin[0], bbMin[1], bbMin[2]), btVector3(bbMin[0], bbMin[1], bbMax[2]), color);
		drawLine(btVector3(bbMax[0], bbMin[1], bbMin[2]), btVector3(bbMax[0], bbMin[1], bbMax[2]), color);
		drawLine(btVector3(bbMax[0], bbMax[1], bbMin[2]), btVector3(bbMax[0], bbMax[1], bbMax[2]), color);
		drawLine(btVector3(bbMin[0], bbMax[1], bbMin[2]), btVector3(bbMin[0], bbMax[1], bbMax[2]), color);
		drawLine(btVector3(bbMin[0], bbMin[1], bbMax[2]), btVector3(bbMax[0], bbMin[1], bbMax[2]), color);
		drawLine(btVector3(bbMax[0], bbMin[1], bbMax[2]), btVector3(bbMax[0], bbMax[1], bbMax[2]), color);
		drawLine(btVector3(bbMax[0], bbMax[1], bbMax[2]), btVector3(bbMin[0], bbMax[1], bbMax[2]), color);
		drawLine(btVector3(bbMin[0], bbMax[1], bbMax[2]), btVector3(bbMin[0], bbMin[1], bbMax[2]), color);
	}